

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O0

void __thiscall bf_crc::update_test_vector_count(bf_crc *this)

{
  uint32_t uVar1;
  undefined2 *in_RDI;
  
  *(undefined8 *)(in_RDI + 0x18) = 0;
  if (*(int *)(in_RDI + 2) == 0) {
    if ((*(byte *)(in_RDI + 4) & 1) == 0) {
      uVar1 = max_value((uint8_t)*in_RDI);
      *(ulong *)(in_RDI + 0x18) = (ulong)uVar1;
    }
    else {
      *(ulong *)(in_RDI + 0x18) = (ulong)*(uint *)(in_RDI + 8) - (ulong)*(uint *)(in_RDI + 6);
    }
  }
  else {
    *(undefined8 *)(in_RDI + 0x18) = 1;
  }
  if ((*(byte *)(in_RDI + 10) & 1) != 0) {
    uVar1 = max_value((uint8_t)*in_RDI);
    *(ulong *)(in_RDI + 0x18) = (ulong)uVar1 * *(long *)(in_RDI + 0x18);
  }
  if ((*(byte *)(in_RDI + 0xe) & 1) != 0) {
    uVar1 = max_value((uint8_t)*in_RDI);
    *(ulong *)(in_RDI + 0x18) = (ulong)uVar1 * *(long *)(in_RDI + 0x18);
  }
  if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) << 1;
  }
  if ((*(byte *)(in_RDI + 0x13) & 1) != 0) {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) << 1;
  }
  return;
}

Assistant:

void update_test_vector_count()
		{
			test_vector_count_ = 0;

			// TODO: Check polynomial range and throw exception if too large
			if (polynomial_ > 0) {
				test_vector_count_ = 1;
			} else if (polynomial_range_) {
				test_vector_count_ = (uint64_t)polynomial_end_ - (uint64_t)polynomial_start_;
			} else {
				test_vector_count_ = (uint64_t)max_value(crc_width_);
			}

			if (probe_final_xor_)
				test_vector_count_ *= (uint64_t)max_value(crc_width_);

			if (probe_initial_)
				test_vector_count_ *= (uint64_t)max_value(crc_width_);

			if (probe_reflected_input_)
				test_vector_count_ *= 2;

			if (probe_reflected_output_)
				test_vector_count_ *= 2;

		}